

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void test<double>(char *name)

{
  int iVar1;
  size_t i;
  long lVar2;
  undefined1 *puVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  
  if ((test<double>(char_const*)::dft == '\0') &&
     (iVar1 = __cxa_guard_acquire(&test<double>(char_const*)::dft), iVar1 != 0)) {
    SlidingDFT<double,_64UL>::SlidingDFT(&test<double>::dft);
    __cxa_guard_release(&test<double>(char_const*)::dft);
  }
  puVar3 = &DAT_000fa6d0;
  dVar6 = 0.0;
  lVar5 = 0;
  lVar2 = 0;
  do {
    SlidingDFT<double,_64UL>::update(&test<double>::dft,(double)test1_time_domain_data[lVar2]);
    if (test<double>::dft.data_valid == true) {
      lVar4 = 0;
      do {
        dVar7 = cabs(*(double *)(test<double>::dft.dft[0]._M_value + lVar4 * 2) -
                     *(double *)(puVar3 + lVar4));
        dVar6 = dVar6 + dVar7;
        lVar4 = lVar4 + 8;
      } while (lVar4 != 0x200);
      lVar5 = lVar5 + 0x40;
    }
    lVar2 = lVar2 + 1;
    puVar3 = puVar3 + 0x200;
  } while (lVar2 != 0x79);
  auVar8._8_4_ = (int)((ulong)lVar5 >> 0x20);
  auVar8._0_8_ = lVar5;
  auVar8._12_4_ = 0x45300000;
  printf("%s: compared %zu complex numbers with an average error of %e\n",
         dVar6 / ((auVar8._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)),name,lVar5);
  return;
}

Assistant:

void test(const char *name)
{
	static SlidingDFT<T, test1_FFT_LENGTH> dft;
	double error_sum = 0;
	size_t num_comparisons = 0;

	for (size_t i = 0; i < test1_TIME_LENGTH; i++) {
		dft.update((T)test1_time_domain[i]);
		if (dft.is_data_valid()) {
			for (size_t j = 0; j < test1_FFT_LENGTH; j++) {
				complex<double> calculated = dft.dft[j];
				complex<double> exact(test1_dft_real[i - test1_FFT_LENGTH + 1][j], test1_dft_imag[i - test1_FFT_LENGTH + 1][j]);
				double error = abs(calculated - exact);
				/*printf("[%2i,%2i] Calculated (%10.3e,%10.3e); expected (%10.3e,%10.3e), error=%11.6e\n", i, j,
					   calculated.real(), calculated.imag(),
					   exact.real(), exact.imag(),
					   error);*/
				error_sum += error;
				num_comparisons++;
			}
		}
	}
	double mean_error = error_sum / num_comparisons;
	printf("%s: compared %zu complex numbers with an average error of %e\n", name, num_comparisons, mean_error);
}